

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::DynamicMapField::SyncRepeatedFieldWithMapNoLock(DynamicMapField *this)

{
  pointer pcVar1;
  Arena *this_00;
  value_type *pvVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  Type TVar6;
  uint32 uVar7;
  int32 iVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FieldDescriptor *this_01;
  undefined4 extraout_var_01;
  FieldDescriptor *this_02;
  RepeatedPtrField<google::protobuf::Message> *elem;
  LogMessage *other;
  uint64 uVar11;
  string *psVar12;
  int64 iVar13;
  Message *pMVar14;
  long *plVar15;
  MapValueRef *this_03;
  const_iterator it;
  LogFinisher local_81;
  undefined1 local_80 [56];
  iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  local_48;
  long *plVar10;
  
  iVar5 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x16])();
  plVar10 = (long *)CONCAT44(extraout_var,iVar5);
  iVar5 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x17])();
  pcVar1 = local_80 + 0x10;
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"key","");
  this_01 = Descriptor::FindFieldByName
                      ((Descriptor *)CONCAT44(extraout_var_00,iVar5),(string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  iVar5 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x17])();
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"value","");
  this_02 = Descriptor::FindFieldByName
                      ((Descriptor *)CONCAT44(extraout_var_01,iVar5),(string *)local_80);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  if ((this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
      .super_MapFieldBase.repeated_field_ == (RepeatedPtrField<google::protobuf::Message> *)0x0) {
    this_00 = (this->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase.arena_;
    if (this_00 == (Arena *)0x0) {
      elem = (RepeatedPtrField<google::protobuf::Message> *)operator_new(0x18);
      (elem->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
      (elem->super_RepeatedPtrFieldBase).current_size_ = 0;
      (elem->super_RepeatedPtrFieldBase).total_size_ = 0;
      (elem->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    }
    else {
      elem = (RepeatedPtrField<google::protobuf::Message> *)
             Arena::AllocateAligned
                       (this_00,(type_info *)&RepeatedPtrField<google::protobuf::Message>::typeinfo,
                        0x18);
      (elem->super_RepeatedPtrFieldBase).arena_ = this_00;
      (elem->super_RepeatedPtrFieldBase).current_size_ = 0;
      (elem->super_RepeatedPtrFieldBase).total_size_ = 0;
      (elem->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
      Arena::AddListNode(this_00,elem,
                         arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                        );
    }
    (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
    super_MapFieldBase.repeated_field_ = elem;
  }
  RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
            (&((this->
               super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
               ).super_MapFieldBase.repeated_field_)->super_RepeatedPtrFieldBase);
  local_80._8_8_ = (this->map_).elements_;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  ::SearchFrom((iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
                *)local_80,((InnerMap *)local_80._8_8_)->index_of_first_non_null_);
  local_48.m_ = (InnerMap *)local_80._8_8_;
  local_48.node_ = (Node *)local_80._0_8_;
  while (local_48.node_ != (Node *)0x0) {
    iVar5 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[3])();
    RepeatedPtrFieldBase::
    AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
              (&((this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.repeated_field_)->super_RepeatedPtrFieldBase,iVar5);
    pvVar2 = ((local_48.node_)->kv).v_;
    TVar6 = FieldDescriptor::type(this_01);
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar6 * 4)) {
    case 1:
      iVar8 = MapKey::GetInt32Value(&pvVar2->first);
      (**(code **)(*plVar10 + 0xe8))(plVar10,iVar5,this_01,iVar8);
      break;
    case 2:
      iVar13 = MapKey::GetInt64Value(&pvVar2->first);
      (**(code **)(*plVar10 + 0xf0))(plVar10,iVar5,this_01,iVar13);
      break;
    case 3:
      uVar7 = MapKey::GetUInt32Value(&pvVar2->first);
      (**(code **)(*plVar10 + 0xf8))(plVar10,iVar5,this_01,uVar7);
      break;
    case 4:
      uVar11 = MapKey::GetUInt64Value(&pvVar2->first);
      (**(code **)(*plVar10 + 0x100))(plVar10,iVar5,this_01,uVar11);
      break;
    case 5:
    case 6:
    case 8:
    case 10:
      LogMessage::LogMessage
                ((LogMessage *)local_80,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/map_field.cc"
                 ,0x11c);
      other = LogMessage::operator<<((LogMessage *)local_80,"Can\'t get here.");
      LogFinisher::operator=(&local_81,other);
      LogMessage::~LogMessage((LogMessage *)local_80);
      break;
    case 7:
      bVar4 = MapKey::GetBoolValue(&pvVar2->first);
      (**(code **)(*plVar10 + 0x118))(plVar10,iVar5,this_01,bVar4);
      break;
    case 9:
      psVar12 = MapKey::GetStringValue_abi_cxx11_(&pvVar2->first);
      (**(code **)(*plVar10 + 0x120))(plVar10,iVar5,this_01,psVar12);
    }
    pvVar2 = ((local_48.node_)->kv).v_;
    TVar6 = FieldDescriptor::type(this_02);
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar6 * 4) - 1U < 10) {
      this_03 = &pvVar2->second;
      switch(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar6 * 4)) {
      case 1:
        iVar8 = MapValueRef::GetInt32Value(this_03);
        (**(code **)(*plVar10 + 0xe8))(plVar10,iVar5,this_02,iVar8);
        break;
      case 2:
        iVar13 = MapValueRef::GetInt64Value(this_03);
        (**(code **)(*plVar10 + 0xf0))(plVar10,iVar5,this_02,iVar13);
        break;
      case 3:
        uVar7 = MapValueRef::GetUInt32Value(this_03);
        (**(code **)(*plVar10 + 0xf8))(plVar10,iVar5,this_02,uVar7);
        break;
      case 4:
        uVar11 = MapValueRef::GetUInt64Value(this_03);
        (**(code **)(*plVar10 + 0x100))(plVar10,iVar5,this_02,uVar11);
        break;
      case 5:
        dVar3 = MapValueRef::GetDoubleValue(this_03);
        (**(code **)(*plVar10 + 0x110))(SUB84(dVar3,0),plVar10,iVar5,this_02);
        break;
      case 6:
        MapValueRef::GetFloatValue(this_03);
        (**(code **)(*plVar10 + 0x108))(plVar10,iVar5,this_02);
        break;
      case 7:
        bVar4 = MapValueRef::GetBoolValue(this_03);
        (**(code **)(*plVar10 + 0x118))(plVar10,iVar5,this_02,bVar4);
        break;
      case 8:
        iVar9 = MapValueRef::GetEnumValue(this_03);
        (**(code **)(*plVar10 + 0x130))(plVar10,iVar5,this_02,iVar9);
        break;
      case 9:
        psVar12 = MapValueRef::GetStringValue_abi_cxx11_(this_03);
        (**(code **)(*plVar10 + 0x120))(plVar10,iVar5,this_02,psVar12);
        break;
      case 10:
        pMVar14 = MapValueRef::GetMessageValue(this_03);
        plVar15 = (long *)(**(code **)(*plVar10 + 0x138))(plVar10,iVar5,this_02,0);
        (**(code **)(*plVar15 + 0x88))(plVar15,pMVar14);
      }
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
    ::operator++(&local_48);
  }
  return;
}

Assistant:

void DynamicMapField::SyncRepeatedFieldWithMapNoLock() const {
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des =
      default_entry_->GetDescriptor()->FindFieldByName("key");
  const FieldDescriptor* val_des =
      default_entry_->GetDescriptor()->FindFieldByName("value");
  if (MapFieldBase::repeated_field_ == NULL) {
    if (MapFieldBase::arena_ == NULL) {
      MapFieldBase::repeated_field_ = new RepeatedPtrField<Message>();
    } else {
      MapFieldBase::repeated_field_ =
          Arena::CreateMessage<RepeatedPtrField<Message> >(
              MapFieldBase::arena_);
    }
  }

  MapFieldBase::repeated_field_->Clear();

  for (Map<MapKey, MapValueRef>::const_iterator it = map_.begin();
       it != map_.end(); ++it) {
    Message* new_entry = default_entry_->New();
    MapFieldBase::repeated_field_->AddAllocated(new_entry);
    const MapKey& map_key = it->first;
    switch (key_des->cpp_type()) {
      case google::protobuf::FieldDescriptor::CPPTYPE_STRING:
        reflection->SetString(new_entry, key_des, map_key.GetStringValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_INT64:
        reflection->SetInt64(new_entry, key_des, map_key.GetInt64Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_INT32:
        reflection->SetInt32(new_entry, key_des, map_key.GetInt32Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT64:
        reflection->SetUInt64(new_entry, key_des, map_key.GetUInt64Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT32:
        reflection->SetUInt32(new_entry, key_des, map_key.GetUInt32Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_BOOL:
        reflection->SetBool(new_entry, key_des, map_key.GetBoolValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_DOUBLE:
      case google::protobuf::FieldDescriptor::CPPTYPE_FLOAT:
      case google::protobuf::FieldDescriptor::CPPTYPE_ENUM:
      case google::protobuf::FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }
    const MapValueRef& map_val = it->second;
    switch (val_des->cpp_type()) {
      case google::protobuf::FieldDescriptor::CPPTYPE_STRING:
        reflection->SetString(new_entry, val_des, map_val.GetStringValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_INT64:
        reflection->SetInt64(new_entry, val_des, map_val.GetInt64Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_INT32:
        reflection->SetInt32(new_entry, val_des, map_val.GetInt32Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT64:
        reflection->SetUInt64(new_entry, val_des, map_val.GetUInt64Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT32:
        reflection->SetUInt32(new_entry, val_des, map_val.GetUInt32Value());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_BOOL:
        reflection->SetBool(new_entry, val_des, map_val.GetBoolValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_DOUBLE:
        reflection->SetDouble(new_entry, val_des, map_val.GetDoubleValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_FLOAT:
        reflection->SetFloat(new_entry, val_des, map_val.GetFloatValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_ENUM:
        reflection->SetEnumValue(new_entry, val_des, map_val.GetEnumValue());
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = map_val.GetMessageValue();
        reflection->MutableMessage(new_entry, val_des)->CopyFrom(message);
        break;
      }
    }
  }
}